

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall
Js::FunctionBodyPolymorphicInlineCache::PrintStats
          (FunctionBodyPolymorphicInlineCache *this,InlineCacheData *data)

{
  uint uVar1;
  uint uVar2;
  uint16 uVar3;
  ScriptContext *this_00;
  ThreadContext *this_01;
  PropertyRecord *this_02;
  char16 *pcVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  uint uVar7;
  float fVar8;
  char16_t *local_8b0;
  char16 *propName;
  WCHAR local_878 [2];
  uint total;
  wchar funcName [1024];
  char16 debugStringBuffer [42];
  InlineCacheData *data_local;
  FunctionBodyPolymorphicInlineCache *this_local;
  
  uVar7 = data->hits + data->misses;
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this->functionBody);
  this_01 = ScriptContext::GetThreadContext(this_00);
  this_02 = ThreadContext::GetPropertyName(this_01,data->propertyId);
  pcVar4 = PropertyRecord::GetBuffer(this_02);
  pcVar5 = ParseableFunctionInfo::GetExternalDisplayName
                     (&this->functionBody->super_ParseableFunctionInfo);
  pcVar6 = FunctionProxy::GetDebugNumberSet
                     ((FunctionProxy *)this->functionBody,(wchar (*) [42])(funcName + 0x3fc));
  swprintf_s<1024ul>((WCHAR (*) [1024])local_878,L"%s (%s)",pcVar5,pcVar6);
  if ((data->isGetCache & 1U) == 0) {
    local_8b0 = L"set";
  }
  else {
    local_8b0 = L"get";
  }
  uVar1 = data->misses;
  uVar2 = data->collisions;
  fVar8 = (float)uVar7;
  uVar3 = PolymorphicInlineCache::GetSize(&this->super_PolymorphicInlineCache);
  Output::Print(L"%s,%s,%s,%d,%d,%f,%d,%f,%d\n",(double)((float)uVar1 / fVar8),
                (double)((float)uVar2 / fVar8),local_878,pcVar4,local_8b0,(ulong)uVar7,(ulong)uVar1,
                uVar2,(uint)uVar3);
  return;
}

Assistant:

void FunctionBodyPolymorphicInlineCache::PrintStats(InlineCacheData *data) const
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        wchar funcName[1024];
        uint total = data->hits + data->misses;
        char16 const *propName = this->functionBody->GetScriptContext()->GetThreadContext()->GetPropertyName(data->propertyId)->GetBuffer();
        swprintf_s(funcName, _u("%s (%s)"), this->functionBody->GetExternalDisplayName(), this->functionBody->GetDebugNumberSet(debugStringBuffer));

        Output::Print(_u("%s,%s,%s,%d,%d,%f,%d,%f,%d\n"),
            funcName,
            propName,
            data->isGetCache ? _u("get") : _u("set"),
            total,
            data->misses,
            static_cast<float>(data->misses) / total,
            data->collisions,
            static_cast<float>(data->collisions) / total,
            GetSize()
        );
    }